

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  iterator iVar1;
  iterator iVar2;
  string *local_208;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15d;
  undefined1 local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  allocator local_158;
  allocator local_157;
  anon_class_1_0_00000001 openAndProcess;
  allocator local_155 [20];
  allocator local_141;
  string *local_140;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_15c = 1;
  local_140 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"1-normal",&local_141);
  local_140 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"2-noisy",local_155);
  local_140 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"3-blurry",(allocator *)&openAndProcess);
  local_140 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"4-collapsed",&local_157);
  local_140 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"5-blurry_noisy",&local_158);
  local_140 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"6-collapsed_noisy",&local_159);
  local_140 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"7-collapsed_blurry",&local_15a);
  local_140 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"8-collapsed_blurry_noisy",&local_15b);
  local_15c = 0;
  local_38 = (iterator)local_138;
  local_30 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_15d);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,&local_15d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_15d);
  local_208 = (string *)&local_38;
  do {
    local_208 = local_208 + -0x20;
    std::__cxx11::string::~string(local_208);
  } while (local_208 != local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::~allocator((allocator<char> *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_157);
  std::allocator<char>::~allocator((allocator<char> *)&openAndProcess);
  std::allocator<char>::~allocator((allocator<char> *)local_155);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  iVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_28);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_28);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,main::__0>
            (iVar1._M_current,iVar2._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<string> files{"1-normal", "2-noisy", "3-blurry", "4-collapsed", "5-blurry_noisy", "6-collapsed_noisy", "7-collapsed_blurry", "8-collapsed_blurry_noisy"};
    auto openAndProcess = [](string name) {cout << name <<endl;processImage(imread(name + ".jpg", 0), name[0]);};
    for_each(files.begin(), files.end(), openAndProcess);
}